

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_loadCEntropy(ZSTD_compressedBlockState_t *bs,void *workspace,short *offcodeNCount,
                        uint *offcodeMaxValue,void *dict,size_t dictSize)

{
  uint uVar1;
  U32 UVar2;
  size_t sVar3;
  size_t sVar4;
  ZSTD_compressedBlockState_t *code;
  size_t err_code_1;
  size_t litlengthHeaderSize;
  uint litlengthLog;
  uint litlengthMaxValue;
  short litlengthNCount [36];
  size_t err_code;
  size_t matchlengthHeaderSize;
  uint matchlengthLog;
  uint matchlengthMaxValue;
  short matchlengthNCount [53];
  size_t offcodeHeaderSize;
  size_t sStack_60;
  uint offcodeLog;
  size_t hufHeaderSize;
  uint hasZeroWeights;
  uint maxSymbolValue;
  BYTE *dictEnd;
  BYTE *dictPtr;
  size_t dictSize_local;
  void *dict_local;
  uint *offcodeMaxValue_local;
  short *offcodeNCount_local;
  void *workspace_local;
  ZSTD_compressedBlockState_t *bs_local;
  
  _hasZeroWeights = (BYTE *)((long)dict + dictSize);
  dictEnd = (BYTE *)((long)dict + 8);
  (bs->entropy).huf.repeatMode = HUF_repeat_check;
  hufHeaderSize._4_4_ = 0xff;
  hufHeaderSize._0_4_ = 1;
  dictPtr = (BYTE *)dictSize;
  dictSize_local = (size_t)dict;
  dict_local = offcodeMaxValue;
  offcodeMaxValue_local = (uint *)offcodeNCount;
  offcodeNCount_local = (short *)workspace;
  workspace_local = bs;
  sStack_60 = HUF_readCTable((HUF_CElt *)bs,(uint *)((long)&hufHeaderSize + 4),dictEnd,
                             (long)_hasZeroWeights - (long)dictEnd,(uint *)&hufHeaderSize);
  if ((int)hufHeaderSize == 0) {
    *(undefined4 *)((long)workspace_local + 0x400) = 2;
  }
  uVar1 = ERR_isError(sStack_60);
  if (uVar1 == 0) {
    if (hufHeaderSize._4_4_ < 0xff) {
      bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
    }
    else {
      dictEnd = dictEnd + sStack_60;
      sVar3 = FSE_readNCount((short *)offcodeMaxValue_local,(uint *)dict_local,
                             (uint *)((long)&offcodeHeaderSize + 4),dictEnd,
                             (long)_hasZeroWeights - (long)dictEnd);
      uVar1 = ERR_isError(sVar3);
      if (uVar1 == 0) {
        if (offcodeHeaderSize._4_4_ < 9) {
          sVar4 = FSE_buildCTable_wksp
                            ((FSE_CTable *)((long)workspace_local + 0x404),
                             (short *)offcodeMaxValue_local,0x1f,offcodeHeaderSize._4_4_,
                             offcodeNCount_local,0x1800);
          uVar1 = ERR_isError(sVar4);
          if (uVar1 == 0) {
            dictEnd = dictEnd + sVar3;
            matchlengthHeaderSize._4_4_ = 0x34;
            sVar3 = FSE_readNCount((short *)&matchlengthLog,
                                   (uint *)((long)&matchlengthHeaderSize + 4),
                                   (uint *)&matchlengthHeaderSize,dictEnd,
                                   (long)_hasZeroWeights - (long)dictEnd);
            uVar1 = ERR_isError(sVar3);
            if (uVar1 == 0) {
              if ((uint)matchlengthHeaderSize < 10) {
                litlengthNCount._64_8_ =
                     ZSTD_checkDictNCount((short *)&matchlengthLog,matchlengthHeaderSize._4_4_,0x34)
                ;
                uVar1 = ERR_isError(litlengthNCount._64_8_);
                if (uVar1 == 0) {
                  sVar4 = FSE_buildCTable_wksp
                                    ((FSE_CTable *)((long)workspace_local + 0x708),
                                     (short *)&matchlengthLog,matchlengthHeaderSize._4_4_,
                                     (uint)matchlengthHeaderSize,offcodeNCount_local,0x1800);
                  uVar1 = ERR_isError(sVar4);
                  if (uVar1 == 0) {
                    dictEnd = dictEnd + sVar3;
                    litlengthHeaderSize._4_4_ = 0x23;
                    sVar3 = FSE_readNCount((short *)&litlengthLog,
                                           (uint *)((long)&litlengthHeaderSize + 4),
                                           (uint *)&litlengthHeaderSize,dictEnd,
                                           (long)_hasZeroWeights - (long)dictEnd);
                    uVar1 = ERR_isError(sVar3);
                    if (uVar1 == 0) {
                      if ((uint)litlengthHeaderSize < 10) {
                        code = (ZSTD_compressedBlockState_t *)
                               ZSTD_checkDictNCount
                                         ((short *)&litlengthLog,litlengthHeaderSize._4_4_,0x23);
                        uVar1 = ERR_isError((size_t)code);
                        bs_local = code;
                        if (uVar1 == 0) {
                          sVar4 = FSE_buildCTable_wksp
                                            ((FSE_CTable *)((long)workspace_local + 0xcb4),
                                             (short *)&litlengthLog,litlengthHeaderSize._4_4_,
                                             (uint)litlengthHeaderSize,offcodeNCount_local,0x1800);
                          uVar1 = ERR_isError(sVar4);
                          if (uVar1 == 0) {
                            dictEnd = dictEnd + sVar3;
                            if (_hasZeroWeights < dictEnd + 0xc) {
                              bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
                            }
                            else {
                              UVar2 = MEM_readLE32(dictEnd);
                              *(U32 *)((long)workspace_local + 0x11e4) = UVar2;
                              UVar2 = MEM_readLE32(dictEnd + 4);
                              *(U32 *)((long)workspace_local + 0x11e8) = UVar2;
                              UVar2 = MEM_readLE32(dictEnd + 8);
                              *(U32 *)((long)workspace_local + 0x11ec) = UVar2;
                              bs_local = (ZSTD_compressedBlockState_t *)
                                         (dictEnd + (0xc - dictSize_local));
                            }
                          }
                          else {
                            bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
                          }
                        }
                      }
                      else {
                        bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
                      }
                    }
                    else {
                      bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
                    }
                  }
                  else {
                    bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
                  }
                }
                else {
                  bs_local = (ZSTD_compressedBlockState_t *)litlengthNCount._64_8_;
                }
              }
              else {
                bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
              }
            }
            else {
              bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
            }
          }
          else {
            bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
          }
        }
        else {
          bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
        }
      }
      else {
        bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
      }
    }
  }
  else {
    bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe2;
  }
  return (size_t)bs_local;
}

Assistant:

size_t ZSTD_loadCEntropy(ZSTD_compressedBlockState_t* bs, void* workspace,
                         short* offcodeNCount, unsigned* offcodeMaxValue,
                         const void* const dict, size_t dictSize)
{
    const BYTE* dictPtr = (const BYTE*)dict;    /* skip magic num and dict ID */
    const BYTE* const dictEnd = dictPtr + dictSize;
    dictPtr += 8;
    bs->entropy.huf.repeatMode = HUF_repeat_check;

    {   unsigned maxSymbolValue = 255;
        unsigned hasZeroWeights = 1;
        size_t const hufHeaderSize = HUF_readCTable((HUF_CElt*)bs->entropy.huf.CTable, &maxSymbolValue, dictPtr,
            dictEnd-dictPtr, &hasZeroWeights);

        /* We only set the loaded table as valid if it contains all non-zero
         * weights. Otherwise, we set it to check */
        if (!hasZeroWeights)
            bs->entropy.huf.repeatMode = HUF_repeat_valid;

        RETURN_ERROR_IF(HUF_isError(hufHeaderSize), dictionary_corrupted);
        RETURN_ERROR_IF(maxSymbolValue < 255, dictionary_corrupted);
        dictPtr += hufHeaderSize;
    }

    {   unsigned offcodeLog;
        size_t const offcodeHeaderSize = FSE_readNCount(offcodeNCount, offcodeMaxValue, &offcodeLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(offcodeHeaderSize), dictionary_corrupted);
        RETURN_ERROR_IF(offcodeLog > OffFSELog, dictionary_corrupted);
        /* Defer checking offcodeMaxValue because we need to know the size of the dictionary content */
        /* fill all offset symbols to avoid garbage at end of table */
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.offcodeCTable,
                offcodeNCount, MaxOff, offcodeLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted);
        dictPtr += offcodeHeaderSize;
    }

    {   short matchlengthNCount[MaxML+1];
        unsigned matchlengthMaxValue = MaxML, matchlengthLog;
        size_t const matchlengthHeaderSize = FSE_readNCount(matchlengthNCount, &matchlengthMaxValue, &matchlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(matchlengthHeaderSize), dictionary_corrupted);
        RETURN_ERROR_IF(matchlengthLog > MLFSELog, dictionary_corrupted);
        /* Every match length code must have non-zero probability */
        FORWARD_IF_ERROR( ZSTD_checkDictNCount(matchlengthNCount, matchlengthMaxValue, MaxML));
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.matchlengthCTable,
                matchlengthNCount, matchlengthMaxValue, matchlengthLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted);
        dictPtr += matchlengthHeaderSize;
    }

    {   short litlengthNCount[MaxLL+1];
        unsigned litlengthMaxValue = MaxLL, litlengthLog;
        size_t const litlengthHeaderSize = FSE_readNCount(litlengthNCount, &litlengthMaxValue, &litlengthLog, dictPtr, dictEnd-dictPtr);
        RETURN_ERROR_IF(FSE_isError(litlengthHeaderSize), dictionary_corrupted);
        RETURN_ERROR_IF(litlengthLog > LLFSELog, dictionary_corrupted);
        /* Every literal length code must have non-zero probability */
        FORWARD_IF_ERROR( ZSTD_checkDictNCount(litlengthNCount, litlengthMaxValue, MaxLL));
        RETURN_ERROR_IF(FSE_isError(FSE_buildCTable_wksp(
                bs->entropy.fse.litlengthCTable,
                litlengthNCount, litlengthMaxValue, litlengthLog,
                workspace, HUF_WORKSPACE_SIZE)),
            dictionary_corrupted);
        dictPtr += litlengthHeaderSize;
    }

    RETURN_ERROR_IF(dictPtr+12 > dictEnd, dictionary_corrupted);
    bs->rep[0] = MEM_readLE32(dictPtr+0);
    bs->rep[1] = MEM_readLE32(dictPtr+4);
    bs->rep[2] = MEM_readLE32(dictPtr+8);
    dictPtr += 12;

    return dictPtr - (const BYTE*)dict;
}